

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ClearTex2DCase::iterate(ClearTex2DCase *this)

{
  glBindRenderbufferFunc p_Var1;
  glBindTextureFunc p_Var2;
  glBindFramebufferFunc p_Var3;
  glFramebufferRenderbufferFunc p_Var4;
  glFramebufferTexture2DFunc p_Var5;
  int iVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  RenderContext *context;
  undefined4 extraout_var;
  TestLog *log;
  char *description;
  ConstPixelBufferAccess local_1d0;
  ConstPixelBufferAccess local_1a8;
  undefined1 local_179;
  undefined1 local_178 [7];
  bool compareOk;
  PixelBufferAccess local_150;
  PixelBufferAccess local_128;
  uint local_fc;
  int local_f8;
  int stencil;
  int clearH;
  int clearW;
  int x;
  int y;
  undefined1 local_e0 [8];
  TextureLevel reference;
  undefined1 local_b0 [8];
  TextureLevel result;
  Texture depthStencilTex;
  undefined1 local_60 [8];
  Renderbuffer colorBuf;
  Framebuffer fbo;
  int cellSize;
  int height;
  int width;
  Functions *gl;
  RenderContext *renderCtx;
  ClearTex2DCase *this_local;
  Functions *gl_00;
  
  context = Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*context->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar6);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorBuf.super_ObjectWrapper.m_object,
             context);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_60,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&result.m_data.m_cap,context);
  tcu::TextureFormat::TextureFormat((TextureFormat *)&reference.m_data.m_cap,RGBA,UNSIGNED_INT32);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)local_b0,(TextureFormat *)&reference.m_data.m_cap,0x7d,0x75,1);
  tcu::TextureFormat::TextureFormat((TextureFormat *)&x,S,UNSIGNED_INT8);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_e0,(TextureFormat *)&x,0x7d,0x75,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  p_Var1 = gl_00->bindRenderbuffer;
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_60);
  (*p_Var1)(0x8d41,dVar7);
  (*gl_00->renderbufferStorage)(0x8d41,0x8236,0x7d,0x75);
  p_Var2 = gl_00->bindTexture;
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)&result.m_data.m_cap);
  (*p_Var2)(0xde1,dVar7);
  (*gl_00->texStorage2D)(0xde1,1,this->m_format,0x7d,0x75);
  p_Var3 = gl_00->bindFramebuffer;
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)&colorBuf.super_ObjectWrapper.m_object);
  (*p_Var3)(0x8d40,dVar7);
  p_Var4 = gl_00->framebufferRenderbuffer;
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_60);
  (*p_Var4)(0x8d40,0x8ce0,0x8d41,dVar7);
  p_Var5 = gl_00->framebufferTexture2D;
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)&result.m_data.m_cap);
  (*p_Var5)(0x8d40,0x821a,0xde1,dVar7,0);
  checkFramebufferStatus(gl_00);
  (*gl_00->enable)(0xc11);
  for (clearW = 0; clearW < 0x75; clearW = clearW + 8) {
    for (clearH = 0; clearH < 0x7d; clearH = clearH + 8) {
      stencil = de::min<int>(8,0x7d - clearH);
      local_f8 = de::min<int>(8,0x75 - clearW);
      dVar7 = deInt32Hash(clearH);
      dVar8 = deInt32Hash(clearW);
      local_fc = (dVar7 ^ dVar8) & 0xff;
      (*gl_00->clearStencil)(local_fc);
      (*gl_00->scissor)(clearH,clearW,stencil,local_f8);
      (*gl_00->clear)(0x400);
      tcu::TextureLevel::getAccess(&local_150,(TextureLevel *)local_e0);
      tcu::getSubregion(&local_128,&local_150,clearH,clearW,stencil,local_f8);
      tcu::clearStencil(&local_128,local_fc);
    }
  }
  (*gl_00->disable)(0xc11);
  (*gl_00->framebufferRenderbuffer)(0x8d40,0x821a,0x8d41,0);
  checkFramebufferStatus(gl_00);
  dVar7 = glu::ObjectWrapper::operator*((ObjectWrapper *)&result.m_data.m_cap);
  blitStencilToColor2D(context,dVar7,0x7d,0x75);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)local_178,(TextureLevel *)local_b0);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_178);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_1a8,(TextureLevel *)local_e0);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_1d0,(TextureLevel *)local_b0);
  local_179 = compareStencilToRed(log,&local_1a8,&local_1d0);
  description = "Image comparison failed";
  if ((bool)local_179) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~local_179 & QP_TEST_RESULT_FAIL,description);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_e0);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_b0);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)&result.m_data.m_cap);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)local_60);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)&colorBuf.super_ObjectWrapper.m_object);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx		= m_context.getRenderContext();
		const glw::Functions&		gl				= renderCtx.getFunctions();
		const int					width			= 125;
		const int					height			= 117;
		const int					cellSize		= 8;
		glu::Framebuffer			fbo				(renderCtx);
		glu::Renderbuffer			colorBuf		(renderCtx);
		glu::Texture				depthStencilTex	(renderCtx);
		TextureLevel				result			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
		TextureLevel				reference		(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);

		checkDepthStencilFormatSupport(m_context, m_format);

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindTexture(GL_TEXTURE_2D, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_format, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		gl.framebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_TEXTURE_2D, *depthStencilTex, 0);
		checkFramebufferStatus(gl);

		gl.enable(GL_SCISSOR_TEST);

		for (int y = 0; y < height; y += cellSize)
		{
			for (int x = 0; x < width; x += cellSize)
			{
				const int		clearW		= de::min(cellSize, width-x);
				const int		clearH		= de::min(cellSize, height-y);
				const int		stencil		= int((deInt32Hash(x) ^ deInt32Hash(y)) & 0xff);

				gl.clearStencil(stencil);
				gl.scissor(x, y, clearW, clearH);
				gl.clear(GL_STENCIL_BUFFER_BIT);

				tcu::clearStencil(tcu::getSubregion(reference.getAccess(), x, y, clearW, clearH), stencil);
			}
		}

		gl.disable(GL_SCISSOR_TEST);

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER, 0);
		checkFramebufferStatus(gl);

		blitStencilToColor2D(renderCtx, *depthStencilTex, width, height);
		glu::readPixels(renderCtx, 0, 0, result.getAccess());

		{
			const bool compareOk = compareStencilToRed(m_testCtx.getLog(), reference, result);
			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}